

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O3

void __thiscall
Centaurus::DFA<unsigned_char>::filter_nodes
          (DFA<unsigned_char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  int iVar1;
  value_type *pvVar2;
  pointer pNVar3;
  int iVar4;
  pointer pDVar5;
  ulong uVar6;
  pointer pDVar7;
  pointer pDVar8;
  NFATransition<unsigned_char> *t;
  value_type *__x;
  DFAState<unsigned_char> *n;
  NFATransition<unsigned_char> *t_1;
  pointer pNVar9;
  ulong uVar10;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  nodes;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  filtered;
  vector<int,_std::allocator<int>_> index_map;
  int local_8c;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  local_88;
  DFA<unsigned_char> *local_70;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  local_68;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_68);
  pDVar8 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar7 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)pDVar8 - (long)pDVar7 >> 3) * -0x71c71c71c71c71c7 -
      ((ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) != 0) {
    __assert_fail("m_states.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/DFA.hpp"
                  ,0xe9,
                  "void Centaurus::DFA<unsigned char>::filter_nodes(const std::vector<bool> &) [TCHAR = unsigned char]"
                 );
  }
  pDVar5 = local_88.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar8;
  local_68.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar7;
  if (pDVar8 != pDVar7) {
    uVar10 = 0;
    local_8c = 0;
    local_70 = this;
    do {
      if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1)
          == 0) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = -1;
      }
      else {
        local_50 = uVar10 * 9;
        local_68.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x = pDVar7[uVar10].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.m_transitions
              .
              super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = pDVar7[uVar10].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                 m_transitions.
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__x != pvVar2) {
          do {
            iVar1 = __x->m_dest;
            uVar6 = (ulong)iVar1;
            iVar4 = iVar1 + 0x3f;
            if (-1 < (long)uVar6) {
              iVar4 = iVar1;
            }
            if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar4 >> 6) +
                  (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
                 >> (uVar6 & 0x3f) & 1) != 0) {
              std::
              vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
              ::push_back((vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                           *)&local_68,__x);
            }
            __x = __x + 1;
          } while (__x != pvVar2);
          pDVar7 = (local_70->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                   super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar8 = (local_70->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                   super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar6 = ((long)pDVar8 - (long)pDVar7 >> 3) * -0x71c71c71c71c71c7;
        if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        std::
        vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
        ::
        emplace_back<Centaurus::DFAState<unsigned_char>&,std::vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>>
                  ((vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
                    *)&local_88,
                   (DFAState<unsigned_char> *)
                   (&(pDVar7->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).
                     _vptr_NFABaseState + local_50),
                   (vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                    *)&local_68);
        this = local_70;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = local_8c;
        local_8c = local_8c + 1;
        std::
        vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
        ::~vector((vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                   *)&local_68);
        pDVar7 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                 super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar8 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                 super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = uVar10 + 1;
      uVar6 = ((long)pDVar8 - (long)pDVar7 >> 3) * -0x71c71c71c71c71c7;
      pDVar5 = local_88.
               super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar8;
      local_68.
      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pDVar7;
    } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
  }
  for (; pDVar5 != local_88.
                   super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pDVar5 = pDVar5 + 1) {
    pNVar3 = (pDVar5->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_transitions.
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar9 = (pDVar5->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_transitions.
                  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar9 != pNVar3; pNVar9 = pNVar9 + 1)
    {
      pNVar9->m_dest =
           *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)pNVar9->m_dest * 4);
    }
  }
  local_68.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x18))->_vptr_NFABase
  ;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 8))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x10))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ((NFABase<Centaurus::DFAState<unsigned_char>_> *)((long)this + 0x18))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>::
  ~vector(&local_68);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>::
  ~vector(&local_88);
  return;
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<DFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<DFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }